

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
          (FunctionDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          FunctionPrototypeSyntax *prototype,Token semi,SyntaxList<slang::syntax::SyntaxNode> *items
          ,Token end,NamedBlockClauseSyntax *endBlockName)

{
  pointer ppSVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  long lVar5;
  undefined8 uVar6;
  
  uVar6 = semi._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,kind,attributes);
  (this->prototype).ptr = prototype;
  (this->semi).kind = (short)uVar6;
  (this->semi).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->semi).info = semi.info;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr =
       (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_ptr;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002daa38;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  (prototype->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppSVar1 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    *(FunctionDeclarationSyntax **)(*(long *)((long)ppSVar1 + lVar5) + 8) = this;
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

FunctionDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, FunctionPrototypeSyntax& prototype, Token semi, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(kind, attributes), prototype(&prototype), semi(semi), items(items), end(end), endBlockName(endBlockName) {
        this->prototype->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }